

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

bool __thiscall miniscript::Node<CPubKey>::IsValid(Node<CPubKey> *this)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  if ((this->typ).m_flags == 0) {
    bVar1 = false;
  }
  else {
    uVar2 = 0xe10;
    if (this->m_script_ctx != P2WSH) {
      if (this->m_script_ctx != TAPSCRIPT) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
      }
      uVar2 = 0x5070a;
    }
    bVar1 = this->scriptlen <= uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsValid() const {
        if (GetType() == ""_mst) return false;
        return ScriptSize() <= internal::MaxScriptSize(m_script_ctx);
    }